

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O3

bool __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator>::operator==
          (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          *rhs)

{
  ushort uVar1;
  ushort uVar2;
  undefined8 uVar3;
  ConstMemberIterator CVar4;
  Number NVar5;
  GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *rhs_00;
  SizeType index;
  Pointer pVVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  undefined8 local_38;
  
  uVar1 = *(ushort *)(this + 0xe);
  uVar2 = (rhs->data_).f.flags;
  if ((uVar1 & 7) != (uVar2 & 7)) goto LAB_0013d2c3;
  bVar7 = true;
  switch(uVar1 & 7) {
  case 3:
    if (*(SizeType *)this == (rhs->data_).s.length) {
      if (uVar1 != 3) {
        __assert_fail("IsObject()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                      ,0x4f4,
                      "ConstMemberIterator rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::MemberBegin() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                     );
      }
      pVVar6 = (Pointer)(*(ulong *)(this + 8) & 0xffffffffffff);
      CVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
                        ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
      if (CVar4.ptr_ == pVVar6) {
        return true;
      }
      while( true ) {
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::FindMember<rapidjson::CrtAllocator>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)&stack0xffffffffffffffc8,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)rhs);
        uVar3 = local_38;
        NVar5.i = (I)GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     ::MemberEnd(rhs);
        if ((uVar3 == NVar5.i64) ||
           (bVar7 = operator==((GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                               &pVVar6->value,
                               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                *)(uVar3 + 0x10)), !bVar7)) break;
        CVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::MemberEnd
                          ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
        pVVar6 = pVVar6 + 1;
        if (pVVar6 == CVar4.ptr_) {
          return true;
        }
      }
    }
    break;
  case 4:
    if (*(SizeType *)this == (rhs->data_).s.length) {
      if (*(SizeType *)this == 0) {
        return true;
      }
      index = 0;
      do {
        this_00 = (GenericValue<rapidjson::UTF8<char>,rapidjson::CrtAllocator> *)
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::operator[]
                            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this,
                             index);
        rhs_00 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](rhs,index);
        bVar7 = operator==(this_00,rhs_00);
        if (!bVar7) {
          return bVar7;
        }
        index = index + 1;
      } while (index < *(uint *)this);
      return bVar7;
    }
    break;
  case 5:
    bVar7 = StringEqual<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>(this,rhs);
    return bVar7;
  case 6:
    if (((uVar2 | uVar1) >> 9 & 1) == 0) {
      bVar7 = *(long *)this == (rhs->data_).n.i64;
    }
    else {
      dVar8 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble
                        ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)this);
      dVar9 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetDouble(rhs);
      bVar7 = (bool)(-(dVar9 == dVar8) & 1);
    }
  default:
    goto switchD_0013d1ce_default;
  }
LAB_0013d2c3:
  bVar7 = false;
switchD_0013d1ce_default:
  return bVar7;
}

Assistant:

bool operator==(const GenericValue<Encoding, SourceAllocator>& rhs) const {
        typedef GenericValue<Encoding, SourceAllocator> RhsType;
        if (GetType() != rhs.GetType())
            return false;

        switch (GetType()) {
        case kObjectType: // Warning: O(n^2) inner-loop
            if (data_.o.size != rhs.data_.o.size)
                return false;           
            for (ConstMemberIterator lhsMemberItr = MemberBegin(); lhsMemberItr != MemberEnd(); ++lhsMemberItr) {
                typename RhsType::ConstMemberIterator rhsMemberItr = rhs.FindMember(lhsMemberItr->name);
                if (rhsMemberItr == rhs.MemberEnd() || (!(lhsMemberItr->value == rhsMemberItr->value)))
                    return false;
            }
            return true;
            
        case kArrayType:
            if (data_.a.size != rhs.data_.a.size)
                return false;
            for (SizeType i = 0; i < data_.a.size; i++)
                if (!((*this)[i] == rhs[i]))
                    return false;
            return true;

        case kStringType:
            return StringEqual(rhs);

        case kNumberType:
            if (IsDouble() || rhs.IsDouble()) {
                double a = GetDouble();     // May convert from integer to double.
                double b = rhs.GetDouble(); // Ditto
                return a >= b && a <= b;    // Prevent -Wfloat-equal
            }
            else
                return data_.n.u64 == rhs.data_.n.u64;

        default:
            return true;
        }
    }